

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O2

void pp_crypto_hash_sha2_512_swap_bytes(puint64 *data,puint words)

{
  ulong uVar1;
  long lVar2;
  
  for (lVar2 = 0; words != (puint)lVar2; lVar2 = lVar2 + 1) {
    uVar1 = data[lVar2];
    data[lVar2] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                  (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                  (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28
                  | uVar1 << 0x38;
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_512_swap_bytes (puint64	*data,
				    puint	words)
{
#ifdef PLIBSYS_IS_BIGENDIAN
	P_UNUSED (data);
	P_UNUSED (words);
#else
	while (words-- > 0) {
		*data = PUINT64_TO_BE (*data);
		++data;
	}
#endif
}